

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storage.c
# Opt level: O0

void advance_storagestate(DLword flg)

{
  LispPTR LVar1;
  DLword flg_local;
  
  *STORAGEFULLSTATE_word = flg | 0xe0000;
  InterfacePage->fullspaceused = 0xffff;
  LVar1 = dremove(STORAGEFULLSTATE_index,*SYSTEMCACHEVARS_word);
  *SYSTEMCACHEVARS_word = LVar1;
  return;
}

Assistant:

static void advance_storagestate(DLword flg) {
#ifdef DEBUG
  printf("STORAGEFULLSTATE is now set to %d \n", flg);
#endif

  *STORAGEFULLSTATE_word = (S_POSITIVE | flg);
  InterfacePage->fullspaceused = 65535;
  *SYSTEMCACHEVARS_word = dremove(STORAGEFULLSTATE_index, *SYSTEMCACHEVARS_word);
}